

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

bool __thiscall Tokenizer::simpleOrWithEq(Tokenizer *this,char c,TokenType type,TokenType typeEq)

{
  Mark MVar1;
  char cVar2;
  int iVar3;
  Mark *pMVar4;
  long *plVar5;
  long *plVar6;
  undefined1 local_d1;
  long *local_d0;
  long local_c8;
  long local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_b0;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_a8 [2];
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_98;
  long local_78 [2];
  TokenType local_68;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  byte local_40;
  Mark local_38;
  
  pMVar4 = Stream::getMark(&this->stream_);
  MVar1 = *pMVar4;
  cVar2 = Stream::peek(&this->stream_);
  if (cVar2 == c) {
    iVar3 = Stream::advance(&this->stream_);
    local_38 = MVar1;
    if (iVar3 == 0x3d) {
      local_a8[0] = &local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,'\x01');
      plVar5 = (long *)std::__cxx11::string::append((char *)local_a8);
      local_d0 = &local_c0;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_c0 = *plVar6;
        uStack_b8 = (undefined4)plVar5[3];
        uStack_b4 = *(undefined4 *)((long)plVar5 + 0x1c);
      }
      else {
        local_c0 = *plVar6;
        local_d0 = (long *)*plVar5;
      }
      local_c8 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_60[0] = local_50;
      local_68 = typeEq;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,local_d0,local_c8 + (long)local_d0);
      local_40 = 0;
      (this->token_).type = local_68;
      local_b0 = &(this->token_).value;
      std::operator=(&local_b0,(string *)local_60,&local_d1);
      (this->token_).mark = local_38;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_40]._M_data)
                ((anon_class_1_0_00000001 *)&local_b0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_60);
      local_40 = 0xff;
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if (local_a8[0] != &local_98) {
        operator_delete(local_a8[0],(long)local_98._M_rest + 1);
      }
      Stream::advance(&this->stream_);
    }
    else {
      local_98._16_8_ = local_78;
      std::__cxx11::string::_M_construct((long)&local_98 + 0x10,'\x01');
      local_60[0] = local_50;
      local_68 = type;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,local_98._16_8_,local_98._24_8_ + local_98._16_8_);
      local_40 = 0;
      (this->token_).type = local_68;
      local_a8[0] = (_Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&(this->token_).value;
      std::operator=(local_a8,(string *)local_60,&local_b0);
      (this->token_).mark = local_38;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_40]._M_data)
                ((anon_class_1_0_00000001 *)local_a8,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_60);
      local_40 = 0xff;
      if ((long *)local_98._16_8_ != local_78) {
        operator_delete((void *)local_98._16_8_,local_78[0] + 1);
      }
    }
  }
  return cVar2 == c;
}

Assistant:

bool Tokenizer::simpleOrWithEq(char c, TokenType type, TokenType typeEq)
{
  const Mark mark = stream_.getMark();
  if(stream_.peek() == c)
  {
    if(stream_.advance() == '=')
    {
      token_ = Token{typeEq, std::string(1, c) + "=", mark};
      stream_.advance();
    }
    else
      token_ = Token{type, std::string(1, c), mark};
  }
  else 
    return false;
  
  return true;
}